

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O3

int cppqc::arbitrarySizedBoundedIntegral<int>(RngEngine *rng,size_t size)

{
  double dVar1;
  result_type_conflict rVar2;
  undefined1 auVar3 [16];
  double dVar4;
  normal_distribution<double> dist;
  normal_distribution<double> local_30;
  
  auVar3._8_4_ = (int)(size >> 0x20);
  auVar3._0_8_ = size;
  auVar3._12_4_ = 0x45300000;
  dVar4 = (auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0);
  dVar1 = 2147483647.0;
  if (dVar4 <= 2147483647.0) {
    dVar1 = dVar4;
  }
  local_30._M_param._M_stddev = dVar1 / 3.0 + 1.0;
  local_30._M_param._M_mean = 0.0;
  local_30._M_saved = 0.0;
  local_30._M_saved_available = false;
  do {
    do {
      rVar2 = std::normal_distribution<double>::operator()(&local_30,rng,&local_30._M_param);
    } while (rVar2 < -2147483648.0);
  } while (2147483647.0 < rVar2);
  return (int)rVar2;
}

Assistant:

Integral arbitrarySizedBoundedIntegral(RngEngine& rng, std::size_t size) {
  const double limit =
      std::min(double(size), double(std::numeric_limits<Integral>::max()));

  // When dividing by 3, about 99% of the values should be
  // in the interval [-limit, limit]
  std::normal_distribution<> dist{0, 1.0 + limit / 3};
  for (;;) {
    double r = dist(rng);

    if (!std::numeric_limits<Integral>::is_signed) {
      r = std::abs(r);
    }

    if (r >= std::numeric_limits<Integral>::lowest() &&
        r <= std::numeric_limits<Integral>::max()) {
      return static_cast<Integral>(r);
    }
  }
}